

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

DdNode ** Cudd_bddPickArbitraryMinterms(DdManager *dd,DdNode *f,DdNode **vars,int n,int k)

{
  int *piVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  DdNode **string;
  DdNode *pDVar6;
  ulong uVar7;
  DdNode **__ptr;
  DdNode **ppDVar8;
  char *__s2;
  ulong uVar9;
  DdNode *g;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  double dVar15;
  int local_6c;
  DdNode **local_58;
  
  uVar10 = (ulong)(uint)k;
  dVar15 = Cudd_CountMinterm(dd,f,n);
  if (dVar15 < (double)k) {
    return (DdNode **)0x0;
  }
  uVar2 = dd->size;
  lVar13 = (long)(int)uVar2;
  string = (DdNode **)malloc((long)k << 3);
  if (string == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    return (DdNode **)0x0;
  }
  if (0 < k) {
    uVar11 = 0;
    do {
      pDVar6 = (DdNode *)malloc(lVar13 + 1);
      string[uVar11] = pDVar6;
      if (pDVar6 == (DdNode *)0x0) {
        free(string);
        dd->errorCode = CUDD_MEMORY_OUT;
        return (DdNode **)0x0;
      }
      if (0 < (int)uVar2) {
        uVar7 = 0;
        do {
          *(char *)((long)&string[uVar11]->index + uVar7) = '2';
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
        pDVar6 = string[uVar11];
      }
      *(char *)((long)&pDVar6->index + lVar13) = '\0';
      uVar11 = uVar11 + 1;
    } while (uVar11 != uVar10);
  }
  __ptr = (DdNode **)malloc((long)n << 2);
  if (__ptr == (DdNode **)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    if (0 < k) {
      uVar11 = 0;
      do {
        if (string[uVar11] != (DdNode *)0x0) {
          free(string[uVar11]);
          string[uVar11] = (DdNode *)0x0;
        }
        uVar11 = uVar11 + 1;
      } while (uVar10 != uVar11);
    }
  }
  else {
    if (0 < n) {
      uVar11 = 0;
      do {
        *(DdHalfWord *)((long)__ptr + uVar11 * 4) = vars[uVar11]->index;
        uVar11 = uVar11 + 1;
      } while ((uint)n != uVar11);
    }
    iVar5 = ddPickArbitraryMinterms(dd,f,n,k,(char **)string);
    if (iVar5 == 0) {
      if (0 < k) {
        uVar11 = 0;
        do {
          if (string[uVar11] != (DdNode *)0x0) {
            free(string[uVar11]);
            string[uVar11] = (DdNode *)0x0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
    }
    else {
      ppDVar8 = (DdNode **)malloc((long)k << 3);
      if (ppDVar8 != (DdNode **)0x0) {
        __s2 = (char *)malloc(lVar13 + 1);
        if (__s2 != (char *)0x0) {
          if (0 < k) {
            uVar7 = (ulong)(k - 1);
            uVar11 = (ulong)(uint)n;
            uVar12 = 0;
            local_6c = -1;
            bVar4 = false;
            local_58 = string;
LAB_00803c28:
            local_58 = local_58 + 1;
            if (bVar4) {
              pDVar6 = string[uVar12];
              iVar5 = strcmp((char *)pDVar6,__s2);
              if (iVar5 != 0) {
                uVar14 = 0;
                do {
                  if (uVar7 == uVar14) goto LAB_00803cab;
                  iVar5 = strcmp((char *)pDVar6,(char *)local_58[uVar14]);
                  uVar14 = uVar14 + 1;
                } while (iVar5 != 0);
                goto LAB_00803c8c;
              }
              bVar4 = true;
              bVar3 = false;
            }
            else {
              uVar14 = 0;
              do {
                if (uVar7 == uVar14) goto LAB_00803cab;
                pDVar6 = string[uVar12];
                iVar5 = strcmp((char *)pDVar6,(char *)local_58[uVar14]);
                uVar14 = uVar14 + 1;
              } while (iVar5 != 0);
LAB_00803c8c:
              strcpy(__s2,(char *)pDVar6);
              bVar3 = true;
              bVar4 = true;
              local_6c = (int)uVar12;
            }
            goto LAB_00803cc3;
          }
          free(__s2);
          goto LAB_00804039;
        }
        dd->errorCode = CUDD_MEMORY_OUT;
        if (0 < k) {
          uVar11 = 0;
          do {
            if (string[uVar11] != (DdNode *)0x0) {
              free(string[uVar11]);
              string[uVar11] = (DdNode *)0x0;
            }
            uVar11 = uVar11 + 1;
          } while (uVar10 != uVar11);
        }
        free(string);
        free(__ptr);
        string = ppDVar8;
        goto LAB_00803f68;
      }
      dd->errorCode = CUDD_MEMORY_OUT;
      if (0 < k) {
        uVar11 = 0;
        do {
          if (string[uVar11] != (DdNode *)0x0) {
            free(string[uVar11]);
            string[uVar11] = (DdNode *)0x0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
      }
    }
    free(string);
    string = __ptr;
  }
  goto LAB_00803f68;
code_r0x00803e46:
  free(__s2);
  if (0 < k) {
    uVar11 = 0;
    do {
      piVar1 = (int *)(((ulong)ppDVar8[uVar11] & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      if (string[uVar11] != (DdNode *)0x0) {
        free(string[uVar11]);
        string[uVar11] = (DdNode *)0x0;
      }
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
  }
LAB_00804039:
  free(string);
  free(__ptr);
  return ppDVar8;
LAB_00803cab:
  bVar3 = true;
  bVar4 = false;
LAB_00803cc3:
  if (0 < n) {
    uVar14 = 0;
    do {
      lVar13 = (long)*(int *)((long)__ptr + uVar14 * 4);
      if (*(char *)((long)&string[uVar12]->index + lVar13) == '2') {
        uVar9 = Cudd_Random();
        *(byte *)((long)&string[uVar12]->index + lVar13) = (uVar9 & 0x20) == 0 ^ 0x31;
      }
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  if (!bVar3) {
    while ((long)local_6c < (long)uVar12) {
      pDVar6 = string[uVar12];
      uVar14 = (long)local_6c;
      while (iVar5 = strcmp((char *)pDVar6,(char *)string[uVar14]), iVar5 != 0) {
        uVar14 = uVar14 + 1;
        if (uVar12 == uVar14) goto LAB_00803d7d;
      }
      strcpy((char *)pDVar6,__s2);
      if (0 < n) {
        uVar14 = 0;
        do {
          lVar13 = (long)*(int *)((long)__ptr + uVar14 * 4);
          if (*(char *)((long)&string[uVar12]->index + lVar13) == '2') {
            uVar9 = Cudd_Random();
            *(byte *)((long)&string[uVar12]->index + lVar13) = (uVar9 & 0x20) == 0 ^ 0x31;
          }
          uVar14 = uVar14 + 1;
        } while (uVar11 != uVar14);
      }
    }
  }
LAB_00803d7d:
  pDVar6 = Cudd_ReadOne(dd);
  ppDVar8[uVar12] = pDVar6;
  piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (0 < n) {
    uVar14 = 0;
    do {
      g = vars[uVar14];
      if (*(char *)((long)&string[uVar12]->index + (long)*(int *)((long)__ptr + uVar14 * 4)) == '0')
      {
        g = (DdNode *)((ulong)g ^ 1);
      }
      pDVar6 = Cudd_bddAnd(dd,pDVar6,g);
      if (pDVar6 == (DdNode *)0x0) {
        free(__s2);
        uVar11 = 0;
        do {
          if (string[uVar11] != (DdNode *)0x0) {
            free(string[uVar11]);
            string[uVar11] = (DdNode *)0x0;
          }
          uVar11 = uVar11 + 1;
        } while (uVar10 != uVar11);
        free(string);
        free(__ptr);
        uVar10 = 0xffffffffffffffff;
        do {
          Cudd_RecursiveDeref(dd,ppDVar8[uVar10 + 1]);
          uVar10 = uVar10 + 1;
          string = ppDVar8;
        } while (uVar12 != uVar10);
        goto LAB_00803f68;
      }
      piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,ppDVar8[uVar12]);
      ppDVar8[uVar12] = pDVar6;
      uVar14 = uVar14 + 1;
    } while (uVar11 != uVar14);
  }
  iVar5 = Cudd_bddLeq(dd,pDVar6,f);
  if (iVar5 != 0) {
    uVar12 = uVar12 + 1;
    uVar7 = uVar7 - 1;
    if (uVar12 == uVar10) goto code_r0x00803e46;
    goto LAB_00803c28;
  }
  free(__s2);
  uVar11 = 0;
  do {
    if (string[uVar11] != (DdNode *)0x0) {
      free(string[uVar11]);
      string[uVar11] = (DdNode *)0x0;
    }
    uVar11 = uVar11 + 1;
  } while (uVar10 != uVar11);
  free(string);
  free(__ptr);
  uVar10 = 0xffffffffffffffff;
  do {
    Cudd_RecursiveDeref(dd,ppDVar8[uVar10 + 1]);
    uVar10 = uVar10 + 1;
    string = ppDVar8;
  } while (uVar12 != uVar10);
LAB_00803f68:
  free(string);
  return (DdNode **)0x0;
}

Assistant:

DdNode **
Cudd_bddPickArbitraryMinterms(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick k minterms */,
  DdNode ** vars /* array of variables */,
  int  n /* size of <code>vars</code> */,
  int  k /* number of minterms to find */)
{
    char **string;
    int i, j, l, size;
    int *indices;
    int result;
    DdNode **old, *neW;
    double minterms;
    char *saveString;
    int saveFlag, savePoint = -1, isSame;

    minterms = Cudd_CountMinterm(dd,f,n);
    if ((double)k > minterms) {
        return(NULL);
    }

    size = dd->size;
    string = ABC_ALLOC(char *, k);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < k; i++) {
        string[i] = ABC_ALLOC(char, size + 1);
        if (string[i] == NULL) {
            for (j = 0; j < i; j++)
                ABC_FREE(string[i]);
            ABC_FREE(string);
            dd->errorCode = CUDD_MEMORY_OUT;
            return(NULL);
        }
        for (j = 0; j < size; j++) string[i][j] = '2';
        string[i][size] = '\0';
    }
    indices = ABC_ALLOC(int,n);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        return(NULL);
    }

    for (i = 0; i < n; i++) {
        indices[i] = vars[i]->index;
    }

    result = ddPickArbitraryMinterms(dd,f,n,k,string);
    if (result == 0) {
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }

    old = ABC_ALLOC(DdNode *, k);
    if (old == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        return(NULL);
    }
    saveString = ABC_ALLOC(char, size + 1);
    if (saveString == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        for (i = 0; i < k; i++)
            ABC_FREE(string[i]);
        ABC_FREE(string);
        ABC_FREE(indices);
        ABC_FREE(old);
        return(NULL);
    }
    saveFlag = 0;

    /* Build result BDD array. */
    for (i = 0; i < k; i++) {
        isSame = 0;
        if (!saveFlag) {
            for (j = i + 1; j < k; j++) {
                if (strcmp(string[i], string[j]) == 0) {
                    savePoint = i;
                    strcpy(saveString, string[i]);
                    saveFlag = 1;
                    break;
                }
            }
        } else {
            if (strcmp(string[i], saveString) == 0) {
                isSame = 1;
            } else {
                saveFlag = 0;
                for (j = i + 1; j < k; j++) {
                    if (strcmp(string[i], string[j]) == 0) {
                        savePoint = i;
                        strcpy(saveString, string[i]);
                        saveFlag = 1;
                        break;
                    }
                }
            }
        }
        /* Randomize choice for don't cares. */
        for (j = 0; j < n; j++) {
            if (string[i][indices[j]] == '2')
                string[i][indices[j]] =
                  (char) ((Cudd_Random() & 0x20) ? '1' : '0');
        }

        while (isSame) {
            isSame = 0;
            for (j = savePoint; j < i; j++) {
                if (strcmp(string[i], string[j]) == 0) {
                    isSame = 1;
                    break;
                }
            }
            if (isSame) {
                strcpy(string[i], saveString);
                /* Randomize choice for don't cares. */
                for (j = 0; j < n; j++) {
                    if (string[i][indices[j]] == '2')
                        string[i][indices[j]] =
                          (char) ((Cudd_Random() & 0x20) ? '1' : '0');
                }
            }
        }

        old[i] = Cudd_ReadOne(dd);
        cuddRef(old[i]);

        for (j = 0; j < n; j++) {
            if (string[i][indices[j]] == '0') {
                neW = Cudd_bddAnd(dd,old[i],Cudd_Not(vars[j]));
            } else {
                neW = Cudd_bddAnd(dd,old[i],vars[j]);
            }
            if (neW == NULL) {
                ABC_FREE(saveString);
                for (l = 0; l < k; l++)
                    ABC_FREE(string[l]);
                ABC_FREE(string);
                ABC_FREE(indices);
                for (l = 0; l <= i; l++)
                    Cudd_RecursiveDeref(dd,old[l]);
                ABC_FREE(old);
                return(NULL);
            }
            cuddRef(neW);
            Cudd_RecursiveDeref(dd,old[i]);
            old[i] = neW;
        }

        /* Test. */
        if (!Cudd_bddLeq(dd,old[i],f)) {
            ABC_FREE(saveString);
            for (l = 0; l < k; l++)
                ABC_FREE(string[l]);
            ABC_FREE(string);
            ABC_FREE(indices);
            for (l = 0; l <= i; l++)
                Cudd_RecursiveDeref(dd,old[l]);
            ABC_FREE(old);
            return(NULL);
        }
    }

    ABC_FREE(saveString);
    for (i = 0; i < k; i++) {
        cuddDeref(old[i]);
        ABC_FREE(string[i]);
    }
    ABC_FREE(string);
    ABC_FREE(indices);
    return(old);

}